

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O3

int envy_bios_parse_xpio(envy_bios *bios,envy_bios_xpio *xpio,int idx)

{
  uint8_t *puVar1;
  ushort uVar2;
  byte bVar3;
  byte bVar4;
  uint8_t uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong in_RAX;
  long lVar11;
  envy_bios_gpio_entry *peVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  char *__format;
  byte bVar16;
  undefined8 uVar17;
  ulong uVar18;
  int iVar19;
  uint8_t bytes [5];
  undefined8 local_38;
  
  uVar2 = xpio->offset;
  if (uVar2 == 0) {
    return 0;
  }
  local_38 = in_RAX;
  if ((uint)uVar2 < bios->length) {
    xpio->version = bios->data[(uint)uVar2];
    iVar15 = 0;
  }
  else {
    xpio->version = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    uVar2 = xpio->offset;
    iVar15 = -0xe;
  }
  uVar13 = (ulong)uVar2;
  lVar11 = uVar13 + 1;
  if ((uint)lVar11 < bios->length) {
    xpio->hlen = bios->data[lVar11];
    iVar19 = 0;
  }
  else {
    xpio->hlen = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar11);
    uVar13 = (ulong)xpio->offset;
    iVar19 = -0xe;
  }
  lVar11 = uVar13 + 2;
  if ((uint)lVar11 < bios->length) {
    xpio->entriesnum = bios->data[lVar11];
    iVar6 = 0;
  }
  else {
    xpio->entriesnum = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar11);
    uVar13 = (ulong)xpio->offset;
    iVar6 = -0xe;
  }
  lVar11 = uVar13 + 3;
  puVar1 = &xpio->rlen;
  if ((uint)lVar11 < bios->length) {
    *puVar1 = bios->data[lVar11];
    iVar7 = 0;
  }
  else {
    xpio->rlen = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar11);
    uVar13 = (ulong)xpio->offset;
    iVar7 = -0xe;
  }
  lVar11 = uVar13 + 4;
  if ((uint)lVar11 < bios->length) {
    xpio->type = bios->data[lVar11];
    iVar8 = 0;
  }
  else {
    xpio->type = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar11);
    uVar13 = (ulong)xpio->offset;
    iVar8 = -0xe;
  }
  uVar14 = (uint)uVar13;
  lVar11 = uVar13 + 5;
  if ((uint)lVar11 < bios->length) {
    xpio->addr = bios->data[lVar11];
    iVar9 = 0;
  }
  else {
    xpio->addr = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar11);
    uVar14 = (uint)xpio->offset;
    iVar9 = -0xe;
  }
  if ((uint)((ulong)uVar14 + 6) < bios->length) {
    bVar16 = bios->data[(ulong)uVar14 + 6];
    iVar10 = 0;
  }
  else {
    bVar16 = 0;
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    iVar10 = -0xe;
  }
  if ((((((iVar19 != 0 || iVar15 != 0) || iVar6 != 0) || iVar7 != 0) || iVar8 != 0) || iVar9 != 0)
      || iVar10 != 0) {
    return -0xe;
  }
  envy_bios_block(bios,(uint)xpio->offset,
                  (uint)xpio->entriesnum * (uint)xpio->rlen + (uint)xpio->hlen,"XPIO",idx);
  xpio->unk02_0 = bVar16 & 0xf;
  xpio->bus = bVar16 >> 4 & 1;
  xpio->unk02_5 = bVar16 >> 5;
  uVar5 = xpio->version;
  if (uVar5 != (bios->gpio).xpiodir.version) {
    fwrite("XPIO version mismatch with XPIODIR\n",0x23,1,_stderr);
    uVar5 = xpio->version;
  }
  uVar17 = 2;
  if (uVar5 != '0') {
    if (uVar5 != '@') {
      envy_bios_parse_xpio_cold_2();
      return -0x16;
    }
    uVar17 = 5;
    if (((bios->gpio).version != 'A') && (uVar17 = 4, *puVar1 == '\x02')) {
      envy_bios_parse_xpio_cold_1();
    }
  }
  bVar16 = xpio->hlen;
  if (bVar16 < 7) {
    __format = "XPIO table header too short [%d < %d]\n";
    uVar13 = (ulong)(uint)bVar16;
    uVar17 = 7;
  }
  else {
    uVar13 = (ulong)*puVar1;
    if ((uint)uVar17 <= (uint)*puVar1) {
      if (bVar16 != 7) {
        fprintf(_stderr,"XPIO table header longer than expected [%d > %d]\n",(ulong)(uint)bVar16,7);
        uVar13 = (ulong)*puVar1;
      }
      if ((uint)uVar17 < (uint)uVar13) {
        fprintf(_stderr,"XPIO table record longer than expected [%d > %d]\n",uVar13,uVar17);
      }
      bVar16 = xpio->entriesnum;
      peVar12 = (envy_bios_gpio_entry *)calloc((ulong)bVar16,0x12);
      xpio->entries = peVar12;
      if (peVar12 == (envy_bios_gpio_entry *)0x0) {
        return -0xc;
      }
      if (bVar16 != 0) {
        uVar13 = 0;
        do {
          peVar12 = xpio->entries + uVar13;
          peVar12->offset = (ushort)xpio->rlen * (short)uVar13 + (ushort)xpio->hlen + xpio->offset;
          local_38 = local_38 & 0xffffff0000000000;
          bVar16 = xpio->rlen;
          uVar18 = 0;
          do {
            if (bVar16 <= uVar18) break;
            uVar2 = peVar12->offset;
            if (bios->length <= (uint)uVar2 + (int)uVar18) {
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)((uint)uVar2 + (int)uVar18));
              *(undefined1 *)((long)&local_38 + uVar18) = 0;
              return -0xe;
            }
            *(uint8_t *)((long)&local_38 + uVar18) = bios->data[uVar18 + uVar2];
            uVar18 = uVar18 + 1;
          } while (uVar18 != 5);
          bVar16 = (bios->gpio).version;
          bVar3 = (byte)local_38;
          bVar4 = local_38._1_1_;
          if (bVar16 - 0x30 < 2) {
            if (*puVar1 < 2) {
              return -0xe;
            }
            peVar12->line = bVar3 & 0x1f;
            peVar12->tag = (byte)((ushort)local_38 >> 5) & 0x3f;
            peVar12->log[0] = bVar4 >> 3 & 3;
            peVar12->log[1] = bVar4 >> 5 & 3;
            peVar12->param = bVar4 >> 7;
          }
          else if (bVar16 == 0x40) {
            if (*puVar1 < 4) {
              return -0xe;
            }
            peVar12->line = (byte)local_38 & 0x1f;
            peVar12->unk40_0 = (byte)local_38 >> 5;
            peVar12->tag = local_38._1_1_;
            peVar12->unk40_2 = local_38._2_1_;
            peVar12->def = local_38._3_1_ & 1;
            peVar12->mode = local_38._3_1_ >> 1 & 3;
            peVar12->log[0] = local_38._3_1_ >> 3 & 3;
            peVar12->log[1] = local_38._3_1_ >> 5 & 3;
            peVar12->param = local_38._3_1_ >> 7;
          }
          else {
            if (bVar16 != 0x41) {
              abort();
            }
            if (*puVar1 < 5) {
              return -0xe;
            }
            peVar12->line = (byte)local_38 & 0x3f;
            peVar12->io = (byte)local_38 >> 6 & 1;
            peVar12->def = (byte)local_38 >> 7;
            peVar12->tag = local_38._1_1_;
            peVar12->spec_out = local_38._2_1_;
            peVar12->spec_in = local_38._3_1_ & 0x1f;
            peVar12->gsync = local_38._3_1_ >> 5 & 1;
            peVar12->reserved = local_38._3_1_ >> 6 & 1;
            peVar12->param = local_38._3_1_ >> 7;
            peVar12->lockpin = local_38._4_1_ & 0xf;
            peVar12->log[0] = local_38._4_1_ >> 4 & 3;
            peVar12->log[1] = local_38._4_1_ >> 6;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < xpio->entriesnum);
      }
      xpio->valid = '\x01';
      return 0;
    }
    __format = "XPIO table record too short [%d < %d]\n";
  }
  fprintf(_stderr,__format,uVar13,uVar17);
  return -0x16;
}

Assistant:

int envy_bios_parse_xpio (struct envy_bios *bios, struct envy_bios_xpio *xpio, int idx) {
	if (!xpio->offset)
		return 0;
	int err = 0;
	uint8_t byte2;
	err |= bios_u8(bios, xpio->offset, &xpio->version);
	err |= bios_u8(bios, xpio->offset+1, &xpio->hlen);
	err |= bios_u8(bios, xpio->offset+2, &xpio->entriesnum);
	err |= bios_u8(bios, xpio->offset+3, &xpio->rlen);
	err |= bios_u8(bios, xpio->offset+4, &xpio->type);
	err |= bios_u8(bios, xpio->offset+5, &xpio->addr);
	err |= bios_u8(bios, xpio->offset+6, &byte2);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, xpio->offset, xpio->hlen + xpio->rlen * xpio->entriesnum, "XPIO", idx);
	xpio->unk02_0 = byte2 & 0xf;
	xpio->bus = byte2 >> 4 & 1;
	xpio->unk02_5 = byte2 >> 5;
	int wanthlen = 0;
	int wantrlen = 0;
	if (xpio->version != bios->gpio.xpiodir.version)
		ENVY_BIOS_WARN("XPIO version mismatch with XPIODIR\n");
	switch (xpio->version) {
		case 0x30:
			wanthlen = 7;
			wantrlen = 2;
			break;
		case 0x40:
			wanthlen = 7;
			wantrlen = 4;
			if (bios->gpio.version == 0x41)
				wantrlen = 5;
			else if (xpio->rlen == 2) {
				ENVY_BIOS_WARN("XPIO version 4.0 with 2-byte entries!\n");
				xpio->rlen = 4;
			}
			break;
		default:
			ENVY_BIOS_ERR("Unknown XPIO table version %d.%d\n", xpio->version >> 4, xpio->version & 0xf);
			return -EINVAL;
	}
	if (xpio->hlen < wanthlen) {
		ENVY_BIOS_ERR("XPIO table header too short [%d < %d]\n", xpio->hlen, wanthlen);
		return -EINVAL;
	}
	if (xpio->rlen < wantrlen) {
		ENVY_BIOS_ERR("XPIO table record too short [%d < %d]\n", xpio->rlen, wantrlen);
		return -EINVAL;
	}
	if (xpio->hlen > wanthlen) {
		ENVY_BIOS_WARN("XPIO table header longer than expected [%d > %d]\n", xpio->hlen, wanthlen);
	}
	if (xpio->rlen > wantrlen) {
		ENVY_BIOS_WARN("XPIO table record longer than expected [%d > %d]\n", xpio->rlen, wantrlen);
	}
	xpio->entries = calloc(xpio->entriesnum, sizeof *xpio->entries);
	if (!xpio->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < xpio->entriesnum; i++) {
		struct envy_bios_gpio_entry *entry = &xpio->entries[i];
		entry->offset = xpio->offset + xpio->hlen + xpio->rlen * i;
		/* note: structure is the same as GPIO, but tags are different, and some fields don't make sense */
		uint8_t bytes[5] = { 0 };
		int j;
		for (j = 0; j < 5 && j < xpio->rlen; j++) {
			err |= bios_u8(bios, entry->offset+j, &bytes[j]);
			if (err)
				return -EFAULT;
		}
		uint16_t val;
		/* because someone forgot to bump XPIO version number on 4.1... */
		switch (bios->gpio.version) {
			case 0x30:
			case 0x31:
				if (xpio->rlen < 2)
					return -EFAULT;
				val = bytes[0] | bytes[1] << 8;
				entry->line = val & 0x1f;
				entry->tag = val >> 5 & 0x3f;
				entry->log[0] = val >> 11 & 3;
				entry->log[1] = val >> 13 & 3;
				entry->param = val >> 15 & 1;
				break;
			case 0x40:
				if (xpio->rlen < 4)
					return -EFAULT;
				entry->line = bytes[0] & 0x1f;
				entry->unk40_0 = bytes[0] >> 5 & 7;
				entry->tag = bytes[1];
				entry->unk40_2 = bytes[2];
				entry->def = bytes[3] & 1;
				entry->mode = bytes[3] >> 1 & 3;
				entry->log[0] = bytes[3] >> 3 & 3;
				entry->log[1] = bytes[3] >> 5 & 3;
				entry->param = bytes[3] >> 7 & 1;
				break;
			case 0x41:
				if (xpio->rlen < 5)
					return -EFAULT;
				entry->line = bytes[0] & 0x3f;
				entry->io = bytes[0] >> 6 & 1;
				entry->def = bytes[0] >> 7 & 1;
				entry->tag = bytes[1];
				entry->spec_out = bytes[2];
				entry->spec_in = bytes[3] & 0x1f;
				entry->gsync = bytes[3] >> 5 & 1;
				entry->reserved = bytes[3] >> 6 & 1;
				entry->param = bytes[3] >> 7 & 1;
				entry->lockpin = bytes[4] & 0xf;
				entry->log[0] = bytes[4] >> 4 & 3;
				entry->log[1] = bytes[4] >> 6 & 3;
				break;
			default:
				abort();
		}
	}
	xpio->valid = 1;
	return 0;
}